

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.c
# Opt level: O1

void test_reset_then_close(void)

{
  quicly_stream_id_t stream_id;
  void *pvVar1;
  uint64_t uVar2;
  void *pvVar3;
  int iVar4;
  quicly_stream_t *in_RAX;
  _st_quicly_conn_public_t *c;
  quicly_stream_t *pqVar5;
  uint cond;
  quicly_stream_t *client_stream;
  quicly_stream_t *local_38;
  
  cond = 0;
  local_38 = in_RAX;
  iVar4 = quicly_open_stream(client,&local_38,0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xa6
     );
  stream_id = local_38->stream_id;
  pvVar1 = local_38->data;
  quicly_reset_stream(local_38,0x33039);
  quicly_request_stop(local_38,0x3d431);
  transmit(client,server);
  _ok((uint)((server->super).local.uni.num_streams + (server->super).local.bidi.num_streams +
             (server->super).remote.bidi.num_streams + (server->super).remote.uni.num_streams == 1),
      "%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xaf
     );
  pqVar5 = quicly_get_stream(server,stream_id);
  _ok((uint)(pqVar5 != (quicly_stream_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb1
     );
  uVar2 = (pqVar5->sendstate).final_size;
  pvVar3 = pqVar5->data;
  if (uVar2 != 0xffffffffffffffff) {
    cond = (uint)(((pqVar5->sendstate).acked.ranges)->end == uVar2 + 1);
  }
  _ok(cond,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb3
     );
  _ok((uint)((pqVar5->recvstate).received.num_ranges == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb4
     );
  _ok((uint)(*(int *)((long)pvVar3 + 0x4c) == 0x33039),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb5
     );
  _ok((uint)(*(int *)((long)pvVar3 + 0x48) == 0x3d431),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb6
     );
  quic_now = quic_now + 0x19;
  transmit(server,client);
  _ok(*(int *)((long)pvVar1 + 0x50),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbc
     );
  _ok((uint)(*(int *)((long)pvVar1 + 0x48) == -1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbd
     );
  _ok((uint)(*(int *)((long)pvVar1 + 0x4c) == 0x3d431),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbe
     );
  _ok((uint)((client->super).local.uni.num_streams + (client->super).local.bidi.num_streams +
             (client->super).remote.bidi.num_streams + (client->super).remote.uni.num_streams == 0),
      "%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbf
     );
  quic_now = quic_now + 0x19;
  transmit(client,server);
  _ok(*(int *)((long)pvVar3 + 0x50),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xc4
     );
  _ok((uint)((server->super).local.uni.num_streams + (server->super).local.bidi.num_streams +
             (server->super).remote.bidi.num_streams + (server->super).remote.uni.num_streams == 0),
      "%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xc5
     );
  return;
}

Assistant:

static void test_reset_then_close(void)
{
    quicly_stream_t *client_stream, *server_stream;
    test_streambuf_t *client_streambuf, *server_streambuf;
    uint64_t stream_id;
    int ret;

    /* client sends STOP_SENDING and RESET_STREAM */
    ret = quicly_open_stream(client, &client_stream, 0);
    ok(ret == 0);
    stream_id = client_stream->stream_id;
    client_streambuf = client_stream->data;
    quicly_reset_stream(client_stream, QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(12345));
    quicly_request_stop(client_stream, QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(54321));

    transmit(client, server);

    /* server sends RESET_STREAM and ACKs to the packets received */
    ok(quicly_num_streams(server) == 1);
    server_stream = quicly_get_stream(server, stream_id);
    ok(server_stream != NULL);
    server_streambuf = server_stream->data;
    ok(quicly_sendstate_transfer_complete(&server_stream->sendstate));
    ok(quicly_recvstate_transfer_complete(&server_stream->recvstate));
    ok(server_streambuf->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(12345));
    ok(server_streambuf->error_received.stop_sending == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(54321));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(server, client);

    /* client closes the stream */
    ok(client_streambuf->is_detached);
    ok(client_streambuf->error_received.stop_sending == -1);
    ok(client_streambuf->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(54321));
    ok(quicly_num_streams(client) == 0);

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(client, server);

    ok(server_streambuf->is_detached);
    ok(quicly_num_streams(server) == 0);
}